

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receptor.cpp
# Opt level: O2

void __thiscall indk::Neuron::Receptor::doReset(Receptor *this)

{
  pointer ppPVar1;
  
  ppPVar1 = (this->CPf).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->CPf).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar1) {
    (this->CPf).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar1;
  }
  this->Rs = 0.01;
  this->Lf = 0.0;
  this->Fi = 0.0;
  this->dFi = 0.0;
  ppPVar1 = (this->ReferencePos).
            super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->ReferencePos).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppPVar1) {
    (this->ReferencePos).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppPVar1;
  }
  Position::setPosition(this->PhantomPos,this->DefaultPos);
  this->Locked = false;
  return;
}

Assistant:

void indk::Neuron::Receptor::doReset() {
    CPf.clear();
    Rs = 0.01;
    Lf = 0;
    Fi = 0;
    dFi = 0;
    ReferencePos.clear();
    PhantomPos -> setPosition(DefaultPos);
    Locked = false;
}